

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::MacroNode::do_render
          (MacroNode *this,ostringstream *param_2,shared_ptr<minja::Context> *macro_context)

{
  bool bVar1;
  runtime_error *prVar2;
  element_type *this_00;
  undefined8 in_RDX;
  long in_RDI;
  Value callable;
  VariableExpr *in_stack_fffffffffffffeb8;
  function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
  *in_stack_fffffffffffffed0;
  string *in_stack_fffffffffffffee8;
  Value *in_stack_fffffffffffffef0;
  undefined1 local_f8 [80];
  undefined8 local_a8;
  anon_class_16_2_6830c199 local_98 [2];
  undefined1 local_78 [96];
  undefined8 local_18;
  
  local_18 = in_RDX;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x20));
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"MacroNode.name is null");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x48));
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,"MacroNode.body is null");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_a8 = local_18;
  std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>::
  function<minja::MacroNode::do_render(std::__cxx11::ostringstream&,std::shared_ptr<minja::Context>const&)const::_lambda(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)_1_,void>
            (in_stack_fffffffffffffed0,local_98);
  Value::callable((CallableType *)in_stack_fffffffffffffee8);
  std::function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>::
  ~function((function<minja::Value_(const_std::shared_ptr<minja::Context>_&,_minja::ArgumentsValue_&)>
             *)0x31fadf);
  this_00 = std::__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<minja::Context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x31faec);
  std::__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<minja::VariableExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x31faff);
  VariableExpr::get_name_abi_cxx11_(in_stack_fffffffffffffeb8);
  Value::Value(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  (*this_00->_vptr_Context[5])(this_00,local_f8,local_78);
  Value::~Value((Value *)this_00);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  Value::~Value((Value *)this_00);
  return;
}

Assistant:

void do_render(std::ostringstream &, const std::shared_ptr<Context> & macro_context) const override {
        if (!name) throw std::runtime_error("MacroNode.name is null");
        if (!body) throw std::runtime_error("MacroNode.body is null");
        auto callable = Value::callable([&](const std::shared_ptr<Context> & context, ArgumentsValue & args) {
            auto call_context = macro_context;
            std::vector<bool> param_set(params.size(), false);
            for (size_t i = 0, n = args.args.size(); i < n; i++) {
                auto & arg = args.args[i];
                if (i >= params.size()) throw std::runtime_error("Too many positional arguments for macro " + name->get_name());
                param_set[i] = true;
                auto & param_name = params[i].first;
                call_context->set(param_name, arg);
            }
            for (auto & [arg_name, value] : args.kwargs) {
                auto it = named_param_positions.find(arg_name);
                if (it == named_param_positions.end()) throw std::runtime_error("Unknown parameter name for macro " + name->get_name() + ": " + arg_name);

                call_context->set(arg_name, value);
                param_set[it->second] = true;
            }
            // Set default values for parameters that were not passed
            for (size_t i = 0, n = params.size(); i < n; i++) {
                if (!param_set[i] && params[i].second != nullptr) {
                    auto val = params[i].second->evaluate(context);
                    call_context->set(params[i].first, val);
                }
            }
            return body->render(call_context);
        });
        macro_context->set(name->get_name(), callable);
    }